

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.hpp
# Opt level: O0

String __thiscall
Arguments::RefAction<Bstrlib::String>::match
          (RefAction<Bstrlib::String> *this,Descriptor *desc,String *values,int valuesCount)

{
  undefined4 in_register_0000000c;
  uchar *puVar1;
  uchar *extraout_RDX;
  int in_R8D;
  String SVar2;
  String SVar3;
  String local_40;
  String *pSStack_28;
  int valuesCount_local;
  String *values_local;
  Descriptor *desc_local;
  RefAction<Bstrlib::String> *this_local;
  
  pSStack_28 = (String *)CONCAT44(in_register_0000000c,valuesCount);
  values_local = values;
  desc_local = desc;
  this_local = this;
  if (((in_R8D == values[3].super_tagbstring.mlen) && (in_R8D == 1)) &&
     (pSStack_28 != (String *)0x0)) {
    Bstrlib::String::String(&local_40,pSStack_28);
    Bstrlib::String::operator=(*(String **)&(desc->shortTrigger).super_tagbstring,&local_40);
    Bstrlib::String::~String(&local_40);
    Bstrlib::String::String((String *)this,"");
    puVar1 = extraout_RDX;
  }
  else {
    SVar2 = Bstrlib::operator+((Bstrlib *)this,"Invalid number of arguments for option: ",values + 2
                              );
    puVar1 = SVar2.super_tagbstring.data;
  }
  SVar3.super_tagbstring.data = puVar1;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

virtual String match(const Descriptor & desc, const String * values, const int valuesCount)
        {
            if (valuesCount != desc.requiredValues || valuesCount != 1 || !values) return TRANS("Invalid number of arguments for option: ") + TRANS(desc.longTrigger);
            // If the compiler stops here, it's because there is no known way to convert from a String to your type T. You'll have to provide your own specialization of this template for this
            ref = (T)values[0];
            return "";
        }